

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall lts2::LBDOperator::drawSelfAsCircles(LBDOperator *this,Mat *destImage)

{
  uint uVar1;
  uint uVar2;
  IntegratingCell *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  float fVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 local_118 [2];
  Mat *local_110;
  undefined8 local_108;
  ulong local_100;
  float local_f4;
  LBDOperator *local_f0;
  float local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  int local_b0;
  int iStack_ac;
  undefined8 local_a8;
  int local_a0;
  int iStack_9c;
  float local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  Matx<double,_4,_1> local_78;
  Scalar_<double> local_58;
  Size local_38;
  
  if (**(int **)(destImage + 0x40) == 0 && (*(int **)(destImage + 0x40))[1] == 0) {
    local_38 = this->_patchSize;
    cv::Mat::create(destImage,&local_38,0x10);
  }
  cv::Scalar_<double>::all(&local_58,255.0);
  local_78.val[0] = (double)CONCAT44(local_78.val[0]._4_4_,-0x3efdfffa);
  local_78.val[2] = 8.48798316435515e-314;
  local_78.val[1] = (double)&local_58;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)destImage,(_InputArray *)&local_78);
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_58);
  local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
  local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
  local_58.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  cv::Matx<double,_4,_1>::Matx(&local_78);
  local_78.val[2] = 0.0;
  local_78.val[3] = 0.0;
  local_78.val[0] = 0.0;
  local_78.val[1] = 0.0;
  local_f0 = this;
  for (local_100 = 0; local_100 < *(uint *)&(this->super_LinearOperator).field_0xc;
      local_100 = local_100 + 1) {
    pIVar3 = this->_sensitiveCells;
    uVar1 = this->_basisFunctions[local_100].pos_cell;
    uVar2 = this->_basisFunctions[local_100].neg_cell;
    iVar6 = pIVar3[uVar2].xmax;
    local_e8 = (float)pIVar3[uVar2].ymax;
    local_c8 = ZEXT416((uint)pIVar3[uVar2].ymin);
    local_d8 = ZEXT416((uint)pIVar3[uVar2].xmin);
    local_108 = 0;
    local_118[0] = 0x3010000;
    auVar14._0_4_ = (float)(local_f0->_patchSize).width;
    auVar14._4_4_ = (float)(local_f0->_patchSize).height;
    auVar14._8_8_ = 0;
    auVar12._0_4_ = (float)pIVar3[uVar1].xmin;
    auVar12._4_4_ = (float)pIVar3[uVar1].ymin;
    auVar12._8_8_ = 0;
    auVar12 = divps(auVar12,auVar14);
    local_f4 = (float)(pIVar3[uVar1].ymax + -1) / auVar14._4_4_;
    fVar7 = (float)(int)*(undefined8 *)(destImage + 8);
    fVar11 = (float)(int)((ulong)*(undefined8 *)(destImage + 8) >> 0x20);
    local_88 = CONCAT44(fVar11,fVar7);
    uStack_80 = 0;
    local_110 = destImage;
    fVar8 = rintf(fVar11 * ((float)(pIVar3[uVar1].xmax + -1) / auVar14._0_4_));
    local_98 = rintf(fVar11 * auVar12._0_4_);
    fVar7 = rintf(fVar7 * auVar12._4_4_);
    iVar9 = (int)local_98;
    fVar11 = rintf(local_f4 * (float)local_88);
    iVar4 = (int)fVar11 - (int)fVar7;
    iVar5 = (int)fVar8 - iVar9;
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
    iVar4 = (int)((long)iVar5 / 2);
    iVar9 = iVar4 + iVar9;
    iVar4 = iVar4 + (int)fVar7;
    local_a0 = iVar9;
    iStack_9c = iVar4;
    cv::circle(local_118,&local_a0,(long)iVar5 / 2 & 0xffffffff,&local_58,1,8,0);
    local_108 = 0;
    local_118[0] = 0x3010000;
    local_a8 = CONCAT44(iVar4,iVar9);
    local_110 = destImage;
    cv::circle(local_118,&local_a8,1,&local_78,0xffffffffffffffff,8,0);
    this = local_f0;
    local_108 = 0;
    local_118[0] = 0x3010000;
    auVar10._0_4_ = (float)(local_f0->_patchSize).width;
    auVar10._4_4_ = (float)(local_f0->_patchSize).height;
    auVar10._8_8_ = 0;
    auVar13._0_4_ = (float)(int)local_d8._0_4_;
    auVar13._4_4_ = (float)(int)local_c8._0_4_;
    auVar13._8_4_ = (float)(int)local_d8._4_4_;
    auVar13._12_4_ = (float)(int)local_c8._4_4_;
    auVar14 = divps(auVar13,auVar10);
    local_c8._0_4_ = (float)((int)local_e8 + -1) / auVar10._4_4_;
    fVar7 = (float)(int)*(undefined8 *)(destImage + 8);
    fVar11 = (float)(int)((ulong)*(undefined8 *)(destImage + 8) >> 0x20);
    local_d8._4_4_ = fVar11;
    local_d8._0_4_ = fVar7;
    local_d8._8_8_ = 0;
    local_110 = destImage;
    fVar8 = rintf(fVar11 * ((float)(iVar6 + -1) / auVar10._0_4_));
    local_e8 = rintf(fVar11 * auVar14._0_4_);
    fVar7 = rintf(fVar7 * auVar14._4_4_);
    iVar4 = (int)local_e8;
    fVar11 = rintf((float)local_c8._0_4_ * (float)local_d8._0_4_);
    iVar5 = (int)fVar11 - (int)fVar7;
    iVar6 = (int)fVar8 - iVar4;
    if (iVar5 < iVar6) {
      iVar6 = iVar5;
    }
    iVar5 = (int)((long)iVar6 / 2);
    iVar4 = iVar5 + iVar4;
    iVar5 = iVar5 + (int)fVar7;
    local_b0 = iVar4;
    iStack_ac = iVar5;
    cv::circle(local_118,&local_b0,(long)iVar6 / 2 & 0xffffffff,&local_58,1,8,0);
    local_108 = 0;
    local_118[0] = 0x3010000;
    local_b8 = CONCAT44(iVar5,iVar4);
    local_110 = destImage;
    cv::circle(local_118,&local_b8,1,&local_78,0xffffffffffffffff,8,0);
  }
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfAsCircles(cv::Mat &destImage) const
{
  if (destImage.size() == cv::Size(0,0))
    destImage.create(_patchSize, CV_8UC3);
  
  // Fill with white
  destImage.setTo(cv::Scalar::all(255));

  // Shortcuts
  cv::Scalar red = cv::Scalar(0, 0, 255);
  cv::Scalar black = cv::Scalar(0, 0, 0);

  // Loop over the cells
  for (int i = 0; i < this->pairs(); ++i)
  {
    cv::Point center;
    int radius, xmin, xmax, ymin, ymax;
    float n_xmin, n_xmax, n_ymin, n_ymax;

    lbd::IntegratingCell plus = _sensitiveCells[_basisFunctions[i].pos_cell];
    lbd::IntegratingCell minus = _sensitiveCells[_basisFunctions[i].neg_cell];

    // (+) first
    n_xmin = plus.xmin / (float)_patchSize.width;
    n_xmax = (plus.xmax-1) / (float)_patchSize.width;
    n_ymin = plus.ymin / (float)_patchSize.height;
    n_ymax = (plus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);

    // (-) now
    n_xmin = minus.xmin / (float)_patchSize.width;
    n_xmax = (minus.xmax-1) / (float)_patchSize.width;
    n_ymin = minus.ymin / (float)_patchSize.height;
    n_ymax = (minus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);
  }
}